

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverse
          (Node *this,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  bool bVar1;
  NullableValue<capnp::schema::Node::Reader> *other;
  Reader *pRVar2;
  CompiledModule *pCVar3;
  Vector<capnp::compiler::Compiler::Node_*> *this_00;
  Node **ppNVar4;
  multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
  *this_01;
  Alias *this_02;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_1e0;
  reference local_170;
  pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_> *child_1;
  iterator __end5_1;
  iterator __begin5_1;
  AliasMap *__range5_1;
  Node **child;
  Node **__end5;
  Node **__begin5;
  Vector<capnp::compiler::Compiler::Node_*> *__range5;
  Content *content_1;
  CompiledModule *local_120;
  Content *_content706;
  Node *p;
  Node *_p700;
  Reader *aux;
  Reader *__end7;
  Reader *__begin7;
  Array<capnp::schema::Node::Reader> *__range7;
  Reader *pRStack_e0;
  uint newEagerness;
  Reader *schema;
  Maybe<capnp::schema::Node::Reader> local_c8;
  undefined1 local_90 [8];
  NullableValue<capnp::schema::Node::Reader> _schema683;
  Content *content;
  CompiledModule *local_48;
  Content *_content680;
  SegmentReader *local_38;
  uint *slot;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  Node *pNStack_10;
  uint eagerness_local;
  Node *this_local;
  
  _content680 = (Content *)this;
  slot = (uint *)sourceInfo;
  sourceInfo_local = (Vector<capnp::schema::Node::SourceInfo::Reader> *)finalLoader;
  finalLoader_local = (SchemaLoader *)seen;
  seen_local._4_4_ = eagerness;
  pNStack_10 = this;
  local_38 = (SegmentReader *)
             std::
             unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
             ::operator[](seen,(key_type *)&_content680);
  if ((*(uint *)&local_38->arena & seen_local._4_4_) != seen_local._4_4_) {
    *(uint *)&local_38->arena = seen_local._4_4_ | *(uint *)&local_38->arena;
    getContent((Node *)&content,(State)this);
    local_48 = (CompiledModule *)
               kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                         ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&content);
    if (local_48 != (CompiledModule *)0x0) {
      _schema683.field_1._40_8_ = local_48;
      loadFinalSchema(this,(SchemaLoader *)sourceInfo_local);
      getFinalSchema(&local_c8,this);
      other = kj::_::readMaybe<capnp::schema::Node::Reader>(&local_c8);
      kj::_::NullableValue<capnp::schema::Node::Reader>::NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_90,other);
      kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_c8);
      pRVar2 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_90);
      if ((pRVar2 != (Reader *)0x0) &&
         (pRStack_e0 = kj::_::NullableValue<capnp::schema::Node::Reader>::operator*
                                 ((NullableValue<capnp::schema::Node::Reader> *)local_90),
         seen_local._4_4_ >> 0xf != 0)) {
        __range7._4_4_ = seen_local._4_4_ & 0xffff8000 | seen_local._4_4_ >> 0xf;
        traverseNodeDependencies
                  (this,pRStack_e0,__range7._4_4_,
                   (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                    *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                   (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
        __begin7 = (Reader *)(_schema683.field_1._40_8_ + 0xd8);
        __end7 = kj::Array<capnp::schema::Node::Reader>::begin
                           ((Array<capnp::schema::Node::Reader> *)__begin7);
        aux = kj::Array<capnp::schema::Node::Reader>::end
                        ((Array<capnp::schema::Node::Reader> *)__begin7);
        for (; __end7 != aux; __end7 = __end7 + 1) {
          _p700 = (Node *)__end7;
          traverseNodeDependencies
                    (this,__end7,__range7._4_4_,
                     (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                      *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                     (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
        }
      }
      kj::_::NullableValue<capnp::schema::Node::Reader>::~NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_90);
      kj::Vector<capnp::schema::Node::SourceInfo::Reader>::
      addAll<kj::Array<capnp::schema::Node::SourceInfo::Reader>&>
                ((Vector<capnp::schema::Node::SourceInfo::Reader> *)slot,
                 (Array<capnp::schema::Node::SourceInfo::Reader> *)
                 (_schema683.field_1._40_8_ + 0xf0));
    }
    if (((seen_local._4_4_ & 2) != 0) &&
       (p = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&this->parent), p != (Node *)0x0)) {
      _content706 = (Content *)p;
      traverse(p,seen_local._4_4_,
               (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
               (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
    }
    if ((seen_local._4_4_ & 4) != 0) {
      getContent((Node *)&content_1,(State)this);
      pCVar3 = (CompiledModule *)
               kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                         ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&content_1);
      if (pCVar3 != (CompiledModule *)0x0) {
        this_00 = (Vector<capnp::compiler::Compiler::Node_*> *)
                  ((pCVar3->contentArena).super_MessageBuilder.arenaSpace + 4);
        local_120 = pCVar3;
        __end5 = kj::Vector<capnp::compiler::Compiler::Node_*>::begin(this_00);
        ppNVar4 = kj::Vector<capnp::compiler::Compiler::Node_*>::end(this_00);
        for (; __end5 != ppNVar4; __end5 = __end5 + 1) {
          traverse(*__end5,seen_local._4_4_,
                   (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                    *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                   (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
        }
        this_01 = (multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                   *)((pCVar3->contentArena).super_MessageBuilder.arenaSpace + 8);
        __end5_1 = std::
                   multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                   ::begin(this_01);
        child_1 = (pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>
                   *)std::
                     multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                     ::end(this_01);
        while (bVar1 = std::operator==(&__end5_1,(_Self *)&child_1), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_170 = std::
                      _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>
                      ::operator*(&__end5_1);
          this_02 = kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>::operator->
                              (&local_170->second);
          Alias::compile(&local_1e0,this_02);
          kj::
          Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
          ::~Maybe(&local_1e0);
          std::
          _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>
          ::operator++(&__end5_1);
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverse(uint eagerness, std::unordered_map<Node*, uint>& seen,
                              const SchemaLoader& finalLoader,
                              kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint& slot = seen[this];
  if ((slot & eagerness) == eagerness) {
    // We've already covered this node.
    return;
  }
  slot |= eagerness;

  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    loadFinalSchema(finalLoader);

    KJ_IF_SOME(schema, getFinalSchema()) {
      if (eagerness / DEPENDENCIES != 0) {
        // For traversing dependencies, discard the bits lower than DEPENDENCIES and replace
        // them with the bits above DEPENDENCIES shifted over.
        uint newEagerness = (eagerness & ~(DEPENDENCIES - 1)) | (eagerness / DEPENDENCIES);

        traverseNodeDependencies(schema, newEagerness, seen, finalLoader, sourceInfo);
        for (auto& aux: content.auxSchemas) {
          traverseNodeDependencies(aux, newEagerness, seen, finalLoader, sourceInfo);
        }
      }
    }

    sourceInfo.addAll(content.sourceInfo);
  }

  if (eagerness & PARENTS) {
    KJ_IF_SOME(p, parent) {
      p.traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }

  if (eagerness & CHILDREN) {
    KJ_IF_SOME(content, getContent(Content::EXPANDED)) {
      for (auto& child: content.orderedNestedNodes) {
        child->traverse(eagerness, seen, finalLoader, sourceInfo);
      }

      // Also traverse `using` declarations.
      for (auto& child: content.aliases) {
        child.second->compile();
      }
    }
  }
}